

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O3

void sn76496_w_maxim(SN76489_Context *chip,UINT8 reg,UINT8 data)

{
  byte bVar1;
  int iVar3;
  undefined7 in_register_00000031;
  ulong uVar2;
  
  iVar3 = (int)CONCAT71(in_register_00000031,reg);
  if (iVar3 == 1) {
    chip->PSGStereo = data;
    return;
  }
  if (iVar3 == 0) {
    if ((char)data < '\0') {
      bVar1 = data >> 4 & 7;
      uVar2 = (ulong)bVar1;
      chip->LatchedRegister = bVar1;
      chip->Registers[bVar1] = (ushort)(data & 0xf) | chip->Registers[bVar1] & 0x3f0;
    }
    else {
      uVar2 = (ulong)chip->LatchedRegister;
      if (uVar2 < 5 && (chip->LatchedRegister & 1) == 0) {
        chip->Registers[uVar2] = (data & 0x3f) << 4 | chip->Registers[uVar2] & 0xf;
      }
      else {
        chip->Registers[uVar2] = (ushort)(data & 0xf);
      }
    }
    switch(uVar2) {
    case 0:
    case 2:
    case 4:
      if (chip->Registers[uVar2] == 0) {
        chip->Registers[uVar2] = 1;
        return;
      }
      break;
    case 6:
      chip->NoiseShiftRegister = 0x8000;
      chip->NoiseFreq = (UINT16)(0x10 << ((byte)chip->Registers[6] & 3));
      return;
    }
  }
  return;
}

Assistant:

static void sn76496_w_maxim(SN76489_Context* chip, UINT8 reg, UINT8 data)
{
	switch(reg)
	{
	case SN76496_W_REG:
		SN76489_Write(chip, data);
		break;
	case SN76496_W_GGST:
		SN76489_GGStereoWrite(chip, data);
		break;
	}
	return;
}